

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O0

adaptive_arith_data_model * __thiscall
lzham::adaptive_arith_data_model::operator=
          (adaptive_arith_data_model *this,adaptive_arith_data_model *rhs)

{
  uint *in_RSI;
  adaptive_arith_data_model *in_RDI;
  vector<lzham::adaptive_bit_model> *unaff_retaddr;
  
  in_RDI->m_total_syms = *in_RSI;
  vector<lzham::adaptive_bit_model>::operator=
            ((vector<lzham::adaptive_bit_model> *)rhs,unaff_retaddr);
  return in_RDI;
}

Assistant:

adaptive_arith_data_model& adaptive_arith_data_model::operator= (const adaptive_arith_data_model& rhs)
   {
      m_total_syms = rhs.m_total_syms;
      m_probs = rhs.m_probs;
      return *this;
   }